

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int add_pending_write_callback(CMConnection conn,CMWriteCallbackFunc handler,void *client_data)

{
  CMConnHandlerList ptr;
  CMConnHandlerList p_Var1;
  size_t sVar2;
  ulong uVar3;
  
  ptr = conn->write_callbacks;
  uVar3 = 0;
  p_Var1 = ptr;
  do {
    if (ptr == (CMConnHandlerList)0x0) {
      ptr = (CMConnHandlerList)INT_CMmalloc(0x10);
      uVar3 = 0;
      sVar2 = 1;
LAB_0011ee45:
      conn->write_callbacks = ptr;
      conn->write_callback_len = sVar2;
LAB_0011ee4f:
      ptr[uVar3 & 0xffffffff].func = handler;
      ptr[uVar3 & 0xffffffff].client_data = client_data;
      return (int)uVar3;
    }
    if ((conn->write_callback_len <= uVar3) || (p_Var1->func == (CMCloseHandlerFunc)0x0)) {
      sVar2 = (size_t)((int)uVar3 + 1);
      if (sVar2 <= conn->write_callback_len) goto LAB_0011ee4f;
      ptr = (CMConnHandlerList)INT_CMrealloc(ptr,sVar2 << 4);
      goto LAB_0011ee45;
    }
    uVar3 = uVar3 + 1;
    p_Var1 = p_Var1 + 1;
  } while( true );
}

Assistant:

static int
 add_pending_write_callback(CMConnection conn, CMWriteCallbackFunc handler, 
			    void* client_data)
 {
     int count = 0;
     while (conn->write_callbacks && count < conn->write_callback_len &&
	    (conn->write_callbacks[count].func != NULL)) count++;
     if (count + 1 > conn->write_callback_len) {
	 if (conn->write_callbacks == NULL) {
	     conn->write_callbacks = malloc(sizeof(conn->write_callbacks[0]));
	     conn->write_callback_len = 1;
	 } else {
	     conn->write_callbacks = 
		 realloc(conn->write_callbacks,
			 sizeof(conn->write_callbacks[0])*(count+1));
	     conn->write_callback_len = count+1;
	 }
     }
     conn->write_callbacks[count].func = handler;
     conn->write_callbacks[count].client_data = client_data;
     return count;
 }